

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int set_transfer_url(Curl_easy *data,curl_pushheaders *hp)

{
  CURLU *u_00;
  CURLU *u;
  nghttp2_push_promise *pnStack_38;
  int rc;
  char *url;
  char *pcStack_28;
  CURLUcode uc;
  char *v;
  curl_pushheaders *hp_local;
  Curl_easy *data_local;
  
  pnStack_38 = (nghttp2_push_promise *)0x0;
  u._4_4_ = 0;
  v = (char *)hp;
  hp_local = (curl_pushheaders *)data;
  u_00 = curl_url();
  if (u_00 == (CURLU *)0x0) {
    return 5;
  }
  pcStack_28 = curl_pushheader_byname((curl_pushheaders *)v,":scheme");
  if (pcStack_28 != (char *)0x0) {
    url._4_4_ = curl_url_set(u_00,CURLUPART_SCHEME,pcStack_28,0);
    if (url._4_4_ != CURLUE_OK) {
      u._4_4_ = 1;
      goto LAB_0010f7ea;
    }
    url._4_4_ = 0;
  }
  pcStack_28 = curl_pushheader_byname((curl_pushheaders *)v,":authority");
  if (pcStack_28 != (char *)0x0) {
    url._4_4_ = curl_url_set(u_00,CURLUPART_HOST,pcStack_28,0);
    if (url._4_4_ != CURLUE_OK) {
      u._4_4_ = 2;
      goto LAB_0010f7ea;
    }
    url._4_4_ = 0;
  }
  pcStack_28 = curl_pushheader_byname((curl_pushheaders *)v,":path");
  if (pcStack_28 != (char *)0x0) {
    url._4_4_ = curl_url_set(u_00,CURLUPART_PATH,pcStack_28,0);
    if (url._4_4_ != CURLUE_OK) {
      u._4_4_ = 3;
      goto LAB_0010f7ea;
    }
    url._4_4_ = 0;
  }
  url._4_4_ = curl_url_get(u_00,CURLUPART_URL,(char **)&stack0xffffffffffffffc8,0);
  if (url._4_4_ != CURLUE_OK) {
    u._4_4_ = 4;
  }
LAB_0010f7ea:
  curl_url_cleanup(u_00);
  if (u._4_4_ == 0) {
    if ((*(uint *)&hp_local[0x130].data >> 0x11 & 1) != 0) {
      (*Curl_cfree)(hp_local[0x11e].frame);
    }
    *(uint *)&hp_local[0x130].data = *(uint *)&hp_local[0x130].data & 0xfffdffff | 0x20000;
    hp_local[0x11e].frame = pnStack_38;
    data_local._4_4_ = 0;
  }
  else {
    data_local._4_4_ = u._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static int set_transfer_url(struct Curl_easy *data,
                            struct curl_pushheaders *hp)
{
  const char *v;
  CURLUcode uc;
  char *url = NULL;
  int rc = 0;
  CURLU *u = curl_url();

  if(!u)
    return 5;

  v = curl_pushheader_byname(hp, H2H3_PSEUDO_SCHEME);
  if(v) {
    uc = curl_url_set(u, CURLUPART_SCHEME, v, 0);
    if(uc) {
      rc = 1;
      goto fail;
    }
  }

  v = curl_pushheader_byname(hp, H2H3_PSEUDO_AUTHORITY);
  if(v) {
    uc = curl_url_set(u, CURLUPART_HOST, v, 0);
    if(uc) {
      rc = 2;
      goto fail;
    }
  }

  v = curl_pushheader_byname(hp, H2H3_PSEUDO_PATH);
  if(v) {
    uc = curl_url_set(u, CURLUPART_PATH, v, 0);
    if(uc) {
      rc = 3;
      goto fail;
    }
  }

  uc = curl_url_get(u, CURLUPART_URL, &url, 0);
  if(uc)
    rc = 4;
  fail:
  curl_url_cleanup(u);
  if(rc)
    return rc;

  if(data->state.url_alloc)
    free(data->state.url);
  data->state.url_alloc = TRUE;
  data->state.url = url;
  return 0;
}